

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

ReadStream * __thiscall
soul::PoolAllocator::
allocate<soul::heart::ReadStream,soul::CodeLocation&,soul::heart::Variable&,soul::heart::InputDeclaration&>
          (PoolAllocator *this,CodeLocation *args,Variable *args_1,InputDeclaration *args_2)

{
  PoolItem *pPVar1;
  CodeLocation local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x38);
  local_38.sourceCode.object = (args->sourceCode).object;
  if (local_38.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_38.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_38.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.data = (args->location).data;
  heart::ReadStream::ReadStream
            ((ReadStream *)&pPVar1->item,&local_38,&args_1->super_Expression,args_2);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::ReadStream,_soul::CodeLocation_&,_soul::heart::Variable_&,_soul::heart::InputDeclaration_&>
       ::anon_class_1_0_00000001::__invoke;
  return (ReadStream *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }